

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btBox2dBox2dCollisionAlgorithm::processCollision
          (btBox2dBox2dCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btManifoldResult *this_00;
  btCollisionObjectWrapper *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  long in_RDI;
  btManifoldResult *in_R8;
  btBox2dShape *box1;
  btBox2dShape *box0;
  btTransform *in_stack_00000260;
  btBox2dShape *in_stack_00000268;
  btTransform *in_stack_00000270;
  btBox2dShape *in_stack_00000278;
  btManifoldResult *in_stack_00000280;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    this_00 = (btManifoldResult *)btCollisionObjectWrapper::getCollisionShape(in_RSI);
    btCollisionObjectWrapper::getCollisionShape(in_RDX);
    btManifoldResult::setPersistentManifold(in_R8,*(btPersistentManifold **)(in_RDI + 0x18));
    btCollisionObjectWrapper::getWorldTransform(in_RSI);
    btCollisionObjectWrapper::getWorldTransform(in_RDX);
    b2CollidePolygons(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                      in_stack_00000260);
    if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
      btManifoldResult::refreshContactPoints(this_00);
    }
  }
  return;
}

Assistant:

void btBox2dBox2dCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	if (!m_manifoldPtr)
		return;

	
	const btBox2dShape* box0 = (const btBox2dShape*)body0Wrap->getCollisionShape();
	const btBox2dShape* box1 = (const btBox2dShape*)body1Wrap->getCollisionShape();

	resultOut->setPersistentManifold(m_manifoldPtr);

	b2CollidePolygons(resultOut,box0,body0Wrap->getWorldTransform(),box1,body1Wrap->getWorldTransform());

	//  refreshContactPoints is only necessary when using persistent contact points. otherwise all points are newly added
	if (m_ownManifold)
	{
		resultOut->refreshContactPoints();
	}

}